

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * __thiscall
testing::internal::OsStackTraceGetter::CurrentStackTrace_abi_cxx11_
          (string *__return_storage_ptr__,OsStackTraceGetter *this,int param_1,int param_2)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

GTEST_LOCK_EXCLUDED_(mutex_) {
  return "";
}